

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::SubroutineUniform::~SubroutineUniform(SubroutineUniform *this)

{
  std::__cxx11::string::~string((string *)&this->name);
  UniformValue::~UniformValue(&this->embeddedUIntUniform);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>);
  SubroutineFunctionSet::~SubroutineFunctionSet(&this->functions);
  return;
}

Assistant:

SubroutineUniform(UniformValueGenerator& generator, SubroutineFunctionSet& _functions, Loc _location,
					  int _arraySize = 0, DefOccurence _defOccurence = DefOccurence::ALL_SH, bool _used = true)
		: functions(_functions)
		, location(_location)
		, arraySize(_arraySize)
		, defOccurence(_defOccurence)
		, used(_used)
		, embeddedUIntUniform(GL_UNSIGNED_INT, generator)
	{

		assert(arraySize >= 0);

		if (!arraySize)
		{
			arraySize = 1;
			isArray   = false;
		}
		else
		{
			isArray = true;
		}

		arraySizesSegmented.push_back(arraySize);

		embeddedUIntUniform = UniformValue(UniformType(GL_UNSIGNED_INT, arraySize), generator);
		for (int i = 0; i < arraySize; i++)
		{
			embeddedUIntUniform.uValues[i] = static_cast<GLint>(embeddedUIntUniform.uValues[i] % functions.fn.size());
		}
	}